

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O2

int __thiscall
re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  uint uVar1;
  bool bVar2;
  CharClass *this_00;
  Rune *pRVar3;
  ostream *poVar4;
  string *psVar5;
  Rune *pRVar6;
  int i;
  long lVar7;
  LogMessage LStack_1a8;
  
  switch(re->op_) {
  case '\x01':
    psVar5 = this->t_;
    break;
  case '\x02':
    if (3 < parent_arg) {
      return 0;
    }
    psVar5 = this->t_;
    break;
  case '\x03':
    AppendLiteral(this->t_,(re->field_7).rune_,(bool)((byte)re->parse_flags_ & 1));
    goto switchD_001bf051_default;
  case '\x04':
    for (lVar7 = 0; lVar7 < (re->field_7).field_0.max_; lVar7 = lVar7 + 1) {
      AppendLiteral(this->t_,*(Rune *)((long)&(((re->field_7).field_1.name_)->_M_dataplus)._M_p +
                                      lVar7 * 4),(bool)((byte)re->parse_flags_ & 1));
    }
    if (1 < parent_arg) goto switchD_001bf051_default;
    goto LAB_001bf3a0;
  case '\x05':
    if (parent_arg < 2) goto LAB_001bf3a0;
    goto switchD_001bf051_default;
  case '\x06':
    psVar5 = this->t_;
    if ((psVar5->_M_dataplus)._M_p[psVar5->_M_string_length - 1] == '|') {
      std::__cxx11::string::erase((ulong)psVar5,psVar5->_M_string_length - 1);
    }
    else {
      LogMessage::LogMessage
                (&LStack_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/tostring.cc"
                 ,0xbc);
      poVar4 = std::operator<<((ostream *)&LStack_1a8.str_,"Bad final char: ");
      std::ostream::_M_insert<void_const*>(poVar4);
      LogMessage::~LogMessage(&LStack_1a8);
    }
    if (parent_arg < 3) goto LAB_001bf3a0;
    goto switchD_001bf051_default;
  case '\a':
    psVar5 = this->t_;
    goto LAB_001bf21a;
  case '\b':
    psVar5 = this->t_;
    goto LAB_001bf21a;
  case '\t':
    psVar5 = this->t_;
LAB_001bf21a:
    std::__cxx11::string::append((char *)psVar5);
LAB_001bf381:
    if ((re->parse_flags_ & 0x40) != 0) {
      std::__cxx11::string::append((char *)this->t_);
    }
    if (0 < parent_arg) goto switchD_001bf051_default;
LAB_001bf3a0:
    psVar5 = this->t_;
    goto LAB_001bf3ab;
  case '\n':
    uVar1 = (re->field_7).field_0.max_;
    if (uVar1 == 0xffffffff) {
      psVar5 = this->t_;
      StringPrintf_abi_cxx11_((string *)&LStack_1a8,"{%d,}",(ulong)(uint)(re->field_7).field_0.min_)
      ;
      std::__cxx11::string::append((string *)psVar5);
    }
    else {
      psVar5 = this->t_;
      if ((re->field_7).field_0.min_ == uVar1) {
        StringPrintf_abi_cxx11_((string *)&LStack_1a8,"{%d}",(ulong)uVar1);
        std::__cxx11::string::append((string *)psVar5);
      }
      else {
        StringPrintf_abi_cxx11_((string *)&LStack_1a8,"{%d,%d}");
        std::__cxx11::string::append((string *)psVar5);
      }
    }
    std::__cxx11::string::~string((string *)&LStack_1a8);
    goto LAB_001bf381;
  case '\v':
    psVar5 = this->t_;
    break;
  case '\f':
    psVar5 = this->t_;
    break;
  case '\r':
    psVar5 = this->t_;
    break;
  case '\x0e':
    psVar5 = this->t_;
    break;
  case '\x0f':
    psVar5 = this->t_;
    break;
  case '\x10':
    psVar5 = this->t_;
    break;
  case '\x11':
    psVar5 = this->t_;
    break;
  case '\x12':
    psVar5 = this->t_;
    break;
  case '\x13':
    psVar5 = this->t_;
    break;
  case '\x14':
    psVar5 = this->t_;
    if (*(int *)((re->field_7).field_3.cc_ + 4) != 0) {
      std::__cxx11::string::append((char *)psVar5);
      this_00 = (re->field_7).field_3.cc_;
      bVar2 = CharClass::Contains(this_00,0xfffe);
      if ((bVar2) && (*(int *)(this_00 + 4) != 0x110000)) {
        this_00 = CharClass::Negate(this_00);
        std::__cxx11::string::append((char *)this->t_);
      }
      pRVar3 = *(Rune **)(this_00 + 8);
      for (pRVar6 = pRVar3; pRVar6 != pRVar3 + (long)*(int *)(this_00 + 0x10) * 2;
          pRVar6 = pRVar6 + 2) {
        AppendCCRange(this->t_,*pRVar6,pRVar6[1]);
        pRVar3 = *(Rune **)(this_00 + 8);
      }
      if (this_00 != (re->field_7).field_3.cc_) {
        CharClass::Delete(this_00);
      }
      psVar5 = this->t_;
    }
    break;
  case '\x15':
    std::__cxx11::string::append((char *)this->t_,0x2fc9b4);
  default:
    goto switchD_001bf051_default;
  }
  std::__cxx11::string::append((char *)psVar5);
switchD_001bf051_default:
  if (parent_arg == 3) {
    psVar5 = this->t_;
LAB_001bf3ab:
    std::__cxx11::string::append((char *)psVar5);
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE and yet somehow isn't full.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE) && !cc->full()) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append("(?HaveMatch:%d)", re->match_id());
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}